

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

double bfrac(double x,double a,double b,int *ctr)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar4 = eps(1.0);
  dVar7 = 1.0;
  uVar2 = 1;
  if (dVar4 * 1000.0 < 1.0) {
    dVar6 = 1.0;
    dVar10 = 1.0;
    dVar4 = 1.0;
    dVar5 = 1.0 - ((a + b) * x) / (a + 1.0);
    uVar1 = 1;
    do {
      dVar8 = (double)(int)uVar1;
      dVar11 = dVar8 + a;
      dVar7 = dVar11 + dVar8;
      dVar9 = 1.0;
      if (uVar1 != 1) {
        dVar9 = dVar5;
      }
      dVar8 = ((b - dVar8) * dVar8 * x) / ((dVar7 + -1.0) * dVar7);
      dVar7 = ((dVar11 + b) * -dVar11 * x) / ((dVar7 + 1.0) * dVar7);
      dVar10 = dVar10 * dVar8 + dVar4;
      dVar6 = dVar8 * dVar6 + dVar5;
      dVar8 = dVar7 * dVar5 + dVar6;
      dVar7 = (dVar7 * dVar4 + dVar10) / dVar8;
      uVar2 = uVar1 + 1;
      dVar5 = eps(dVar7);
      if (ABS(dVar7 - dVar4) <= dVar5 * 1000.0) break;
      dVar10 = dVar10 / dVar8;
      dVar6 = dVar6 / dVar8;
      bVar3 = uVar1 < 999;
      dVar4 = dVar7;
      dVar5 = dVar9;
      uVar1 = uVar2;
    } while (bVar3);
  }
  *ctr = uVar2;
  return dVar7;
}

Assistant:

double bfrac(double x,double a, double b, int* ctr) {
	double d2m,d2m1,a0,b0,a1,b1,am,bm,g,g0,delta,a1m,a2m,del;
	int m;
	
	/* This continued fraction computation is based on
	 * equation 26.5.8 Handbook of Mathematical Functions.
	 * by Abramowitz and Stegun. 
	 * If convergence is not achieved in 1000 iterations then
	 * the function will still return values so it is recommended
	 * that calling function 
	 * 
	 * y = bfrac(x,a,b,&controlint)
	 * 
	 * should check controlint and discard the result y
	 * if controlint = 1000.
	 * 
	 */ 
	 m = 1;
	 am = bm = g = 1.;
	 a0 = b0 = a1 = b1 = g0 = 0.;
	 del = 1. - (a+b) * x / (a+1);
	 delta = fabs(g - g0);
	 
	 while ( (delta > 1000*eps(g) ) && (m < 1000) ) {
		 a1m = (double) a + m;
		 a2m = (double) a1m + m;
		 g0 = g;
		 d2m = m * (b - m) * x / (a2m * (a2m - 1.));
		 d2m1 = - a1m * (a1m + b) * x / (a2m * (a2m + 1.));
		 
		 
		 a0 = g + d2m * am;
		 b0 = del + d2m * bm;
		 a1 = a0 + d2m1 * g;
		 b1 = b0 + d2m1 * del;
		 if (m == 1) {
			 del = 1.0;
		 }
		 
		 am = a0 / b1;
		 bm = b0 / b1;
		 g = a1/b1;
		 
		 m++;
		 delta = fabs(g - g0);
	 }
	 
	 *ctr = m;
	 return g;
}